

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteBuiltin_db_set_schema(jx9_context *pCtx,int argc,jx9_value **argv)

{
  int iVar1;
  unqlite_col *pCol_00;
  int local_58;
  int local_54;
  int rc;
  int nByte;
  SyString sName;
  unqlite_vm *pVm;
  char *zName;
  unqlite_col *pCol;
  jx9_value **argv_local;
  int argc_local;
  jx9_context *pCtx_local;
  
  if (argc < 2) {
    jx9_context_throw_error(pCtx,1,"Missing collection name and/or db scheme");
    jx9_result_bool(pCtx,0);
  }
  else {
    iVar1 = jx9_value_is_json_object(argv[1]);
    if (iVar1 == 0) {
      jx9_context_throw_error(pCtx,1,"Invalid collection scheme");
      jx9_result_bool(pCtx,0);
    }
    else {
      _rc = jx9_value_to_string(*argv,&local_54);
      if (local_54 < 1) {
        jx9_context_throw_error(pCtx,1,"Invalid collection name");
        jx9_result_bool(pCtx,0);
      }
      else {
        sName.zString._0_4_ = local_54;
        sName._8_8_ = jx9_context_user_data(pCtx);
        local_58 = -0x14;
        pCol_00 = unqliteCollectionFetch((unqlite_vm *)sName._8_8_,(SyString *)&rc,4);
        if (pCol_00 == (unqlite_col *)0x0) {
          jx9_context_throw_error_format(pCtx,2,"No such collection \'%z\'",&rc);
        }
        else {
          local_58 = unqliteCollectionSetSchema(pCol_00,argv[1]);
        }
        jx9_result_bool(pCtx,(uint)(local_58 == 0));
      }
    }
  }
  return 0;
}

Assistant:

static int unqliteBuiltin_db_set_schema(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	int rc;
	/* Extract collection name */
	if( argc < 2 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name and/or db scheme");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	if( !jx9_value_is_json_object(argv[1]) ){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection scheme");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	rc = UNQLITE_NOOP;
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol ){
		/* Set the collection scheme */
		rc = unqliteCollectionSetSchema(pCol,argv[1]);
	}else{
		jx9_context_throw_error_format(pCtx,JX9_CTX_WARNING,
			"No such collection '%z'",
			&sName
			);
	}
	/* Processing result */
	jx9_result_bool(pCtx,rc == UNQLITE_OK);
	return JX9_OK;
}